

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::containsAfterUintCast
               (set<int,_std::less<int>,_std::allocator<int>_> *haystack,deUint32 needle,
               Precision precision)

{
  bool bVar1;
  reference piVar2;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  Precision precision_local;
  deUint32 needle_local;
  set<int,_std::less<int>,_std::allocator<int>_> *haystack_local;
  
  it._M_node._0_4_ = precision;
  it._M_node._4_4_ = needle;
  local_28._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(haystack)
  ;
  while( true ) {
    local_30._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(haystack)
    ;
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return false;
    }
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&local_28);
    bVar1 = intEqualsAfterUintCast(*piVar2,it._M_node._4_4_,(Precision)it._M_node);
    if (bVar1) break;
    std::_Rb_tree_const_iterator<int>::operator++(&local_28);
  }
  return true;
}

Assistant:

static bool containsAfterUintCast (const std::set<deInt32>& haystack, deUint32 needle, glu::Precision precision)
{
	for (std::set<deInt32>::const_iterator it = haystack.begin(); it != haystack.end(); ++it)
		if (intEqualsAfterUintCast(*it, needle, precision))
			return true;
	return false;
}